

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int AllocateInternalBuffers8b(VP8LDecoder *dec)

{
  void *pvVar1;
  undefined4 *in_RDI;
  uint64_t total_num_pixels;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  *(undefined8 *)(in_RDI + 8) = 0;
  pvVar1 = WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (size_t)in_RDI);
  *(void **)(in_RDI + 6) = pvVar1;
  if (*(long *)(in_RDI + 6) == 0) {
    *in_RDI = 1;
  }
  return (uint)(*(long *)(in_RDI + 6) != 0);
}

Assistant:

static int AllocateInternalBuffers8b(VP8LDecoder* const dec) {
  const uint64_t total_num_pixels = (uint64_t)dec->width_ * dec->height_;
  dec->argb_cache_ = NULL;    // for soundness
  dec->pixels_ = (uint32_t*)WebPSafeMalloc(total_num_pixels, sizeof(uint8_t));
  if (dec->pixels_ == NULL) {
    dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
    return 0;
  }
  return 1;
}